

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<char>::addAll<kj::String>(Vector<char> *this,String *container)

{
  char *__src;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *newSize;
  RemoveConst<char> *__dest;
  char *pcVar6;
  size_t __n;
  
  __src = (container->content).ptr;
  sVar1 = (container->content).size_;
  pcVar6 = __src + (sVar1 - 1);
  if (sVar1 == 0) {
    pcVar6 = (char *)0x0;
    __src = (char *)0x0;
  }
  pcVar2 = (this->builder).ptr;
  __dest = (this->builder).pos;
  __n = (long)pcVar6 - (long)__src;
  pcVar4 = __dest + (__n - (long)pcVar2);
  pcVar3 = (this->builder).endPtr;
  pcVar5 = pcVar3 + -(long)pcVar2;
  if (pcVar5 < pcVar4) {
    newSize = (char *)0x4;
    if (pcVar3 != pcVar2) {
      newSize = (char *)((long)pcVar5 * 2);
    }
    if (newSize < pcVar4) {
      newSize = pcVar4;
    }
    setCapacity(this,(size_t)newSize);
    __dest = (this->builder).pos;
  }
  if (__src != pcVar6) {
    memcpy(__dest,__src,__n);
    __dest = __dest + __n;
  }
  (this->builder).pos = __dest;
  return;
}

Assistant:

inline void addAll(Container&& container) {
    addAll(container.begin(), container.end());
  }